

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_manipulation.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  void *pvVar2;
  ct_constant<2L> *pcVar3;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>_>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>_>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>_>
  *t1;
  ct_binary_expr<_24bf473d_> *pcVar4;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>_>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>_>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>_>_>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>
  *pcVar5;
  ct_variable<0UL> *rhs;
  ct_variable<1UL> *rhs_00;
  ct_variable<0UL> *rhs_01;
  ct_variable<1UL> *rhs_02;
  ct_variable<0UL> *rhs_03;
  ct_variable<1UL> *rhs_04;
  ct_variable<0UL> *rhs_05;
  ct_variable<1UL> *rhs_06;
  ct_variable<0UL> *rhs_07;
  ct_variable<1UL> *rhs_08;
  ct_variable<0UL> *rhs_09;
  ct_variable<1UL> *rhs_10;
  ct_variable<0UL> *rhs_11;
  ct_variable<1UL> *rhs_12;
  ct_variable<0UL> *rhs_13;
  ct_variable<1UL> *rhs_14;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
  *extraout_RDX;
  ct_variable<0UL> *rhs_15;
  ct_variable<1UL> *rhs_16;
  ct_variable<0UL> *rhs_17;
  ct_variable<1UL> *rhs_18;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
  *extraout_RDX_00;
  ct_variable<0UL> *rhs_19;
  ct_variable<0UL> *rhs_20;
  ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>
  *rhs_21;
  ct_variable<0UL> *rhs_22;
  ct_variable<1UL> *rhs_23;
  ct_variable<1UL> *rhs_24;
  ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>
  *rhs_25;
  ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>_>
  *rhs_26;
  ct_binary_expr<viennamath::ct_constant<2L>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>_>_>
  *rhs_27;
  ct_variable<1UL> *rhs_28;
  ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>
  *rhs_29;
  ct_variable<0UL> *rhs_30;
  ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<0UL>_>
  *rhs_31;
  ct_constant<4L> *rhs_32;
  ct_variable<0UL> *rhs_33;
  ct_variable<1UL> *rhs_34;
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>
  *rhs_35;
  ct_variable<2UL> *rhs_36;
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>
  *rhs_37;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>_>
  *extraout_RDX_01;
  ct_variable<0UL> *rhs_38;
  ct_variable<1UL> *rhs_39;
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>
  *rhs_40;
  ct_variable<2UL> *rhs_41;
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>
  *rhs_42;
  ct_variable<0UL> *rhs_43;
  ct_variable<1UL> *rhs_44;
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>
  *rhs_45;
  ct_variable<2UL> *rhs_46;
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>
  *rhs_47;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>_>
  *extraout_RDX_02;
  ct_variable<0UL> *rhs_48;
  ct_variable<1UL> *rhs_49;
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>
  *rhs_50;
  ct_variable<2UL> *rhs_51;
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>
  *rhs_52;
  ct_variable<0UL> *extraout_RDX_03;
  ct_variable<0UL> *rhs_53;
  ct_variable<1UL> *rhs_54;
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>
  *rhs_55;
  ct_variable<2UL> *rhs_56;
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>
  *rhs_57;
  ct_variable<1UL> *extraout_RDX_04;
  ct_variable<0UL> *rhs_58;
  ct_variable<1UL> *rhs_59;
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>
  *rhs_60;
  ct_variable<2UL> *rhs_61;
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>
  *rhs_62;
  ct_variable<2UL> *extraout_RDX_05;
  ct_variable<0UL> *rhs_63;
  ct_variable<1UL> *rhs_64;
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>
  *rhs_65;
  ct_variable<2UL> *rhs_66;
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>
  *rhs_67;
  ct_variable<0UL> *extraout_RDX_06;
  ct_variable<0UL> *rhs_68;
  ct_variable<1UL> *rhs_69;
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>
  *rhs_70;
  ct_variable<2UL> *rhs_71;
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>
  *rhs_72;
  ct_variable<1UL> *extraout_RDX_07;
  ct_variable<0UL> *rhs_73;
  ct_variable<1UL> *rhs_74;
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>
  *rhs_75;
  ct_variable<2UL> *rhs_76;
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>
  *rhs_77;
  ct_variable<2UL> *extraout_RDX_08;
  ct_variable<1UL> *rhs_78;
  ct_variable<1UL> *rhs_79;
  ct_variable<0UL> *rhs_80;
  ct_variable<1UL> *rhs_81;
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>
  *rhs_82;
  ct_variable<0UL> *rhs_83;
  ct_variable<1UL> *rhs_84;
  ct_variable<0UL> *rhs_85;
  ct_variable<1UL> *rhs_86;
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>
  *rhs_87;
  ct_variable<0UL> *rhs_88;
  ct_variable<1UL> *rhs_89;
  ct_variable<0UL> *rhs_90;
  ct_variable<0UL> *rhs_91;
  ct_variable<0UL> *rhs_92;
  ct_variable<0UL> *rhs_93;
  ct_variable<0UL> *rhs_94;
  ct_variable<1UL> *rhs_95;
  ct_variable<0UL> *rhs_96;
  ct_variable<0UL> *rhs_97;
  ct_variable<0UL> *rhs_98;
  ct_variable<1UL> *rhs_99;
  ct_variable<0UL> *rhs_x00100;
  ct_variable<0UL> *rhs_x00101;
  ct_variable<1UL> *rhs_x00102;
  ct_variable<0UL> *rhs_x00103;
  ct_variable<1UL> *rhs_x00104;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>
  *rhs_x00105;
  ct_variable<0UL> *rhs_x00106;
  ct_variable<1UL> *rhs_x00107;
  ct_variable<0UL> *rhs_x00108;
  ct_variable<0UL> *rhs_x00109;
  ct_variable<1UL> *rhs_x00110;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>
  *rhs_x00111;
  ct_variable<0UL> *rhs_x00112;
  ct_variable<0UL> *rhs_x00113;
  ct_variable<1UL> *rhs_x00114;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>
  *rhs_x00115;
  ct_variable<0UL> *in_R8;
  type tVar6;
  undefined1 local_5ee [5];
  ct_interval<viennamath::ct_constant<0L>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>_>
  local_5e9 [7];
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
  local_5e2;
  viennamath local_5e0;
  type local_5df;
  undefined1 local_5cc [29];
  undefined1 local_5af [5];
  viennamath local_5aa [7];
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
  local_5a3;
  undefined1 local_5a1 [17];
  undefined1 local_590 [13];
  viennamath local_583 [5];
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
  local_57e;
  undefined1 local_57c [8];
  undefined1 local_574 [16];
  undefined1 local_564 [10];
  undefined8 local_55a;
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
  local_54c;
  viennamath local_54a;
  type local_549;
  undefined1 local_51b [14];
  viennamath local_50d [5];
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
  local_508;
  undefined1 local_506 [9];
  undefined1 local_4fd [11];
  viennamath local_4f2 [5];
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
  local_4ed;
  undefined4 local_4eb;
  undefined1 local_4e5 [22];
  undefined1 local_4cf [8];
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
  local_4c7;
  undefined1 local_4c5 [14];
  undefined1 local_4b7 [13];
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
  local_4aa;
  undefined1 local_4a8 [7];
  undefined1 local_4a1 [13];
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
  local_494;
  undefined1 local_492 [7];
  undefined1 local_48b [10];
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
  local_481;
  undefined2 local_47f;
  undefined1 local_47b [30];
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
  local_45d [2];
  undefined1 local_459 [6];
  undefined1 local_453 [12];
  undefined1 local_447 [38];
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
  local_421 [2];
  undefined1 local_41d [6];
  undefined1 local_417 [12];
  undefined1 local_40b [15];
  viennamath local_3fc [3];
  undefined1 local_3f9 [7];
  viennamath local_3f2 [3];
  undefined1 local_3ef [16];
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>_>
  local_3df [2];
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
  local_3d7 [2];
  undefined8 local_3d3;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>_>_>
  local_3c7 [3];
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>_>
  local_3b5 [2];
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
  local_3ad [2];
  undefined8 local_3a9;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>_>_>
  local_39d [3];
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>_>
  local_38b [2];
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
  local_383 [2];
  undefined8 local_37f;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>_>_>
  local_373 [5];
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>_>
  local_35a [2];
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
  local_352 [2];
  undefined8 local_34e;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<0L>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_mult<double>,_viennamath::ct_constant<1L>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<0L>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<1L>_>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<0L>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<0L>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>_>_>_>
  local_342 [2];
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>_>
  local_322 [2];
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
  local_31a [2];
  undefined8 local_316;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<0L>,_viennamath::op_minus<double>,_viennamath::ct_constant<0L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_mult<double>,_viennamath::ct_constant<1L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<1L>_>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<0L>,_viennamath::op_minus<double>,_viennamath::ct_constant<0L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>_>_>_>
  local_30a [2];
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>_>
  local_2ea [2];
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
  local_2e2 [2];
  undefined8 local_2de;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<0L>,_viennamath::op_minus<double>,_viennamath::ct_constant<0L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<0L>,_viennamath::op_minus<double>,_viennamath::ct_constant<0L>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_mult<double>,_viennamath::ct_constant<1L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<1L>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>_>_>_>
  local_2d2;
  ct_vector_3<viennamath::ct_constant<1L>,_viennamath::ct_constant<2L>,_viennamath::ct_constant<5L>_>
  local_2c6 [3];
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>_>
  local_2bb [2];
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
  local_2b3 [2];
  undefined8 local_2af;
  type local_2a3;
  ct_vector_3<viennamath::ct_constant<1L>,_viennamath::ct_constant<2L>,_viennamath::ct_constant<5L>_>
  local_28b [3];
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>_>
  local_280 [2];
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
  local_278 [2];
  undefined1 local_274 [20];
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>_>
  local_260 [2];
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
  local_258 [2];
  undefined8 local_254;
  type local_248;
  ct_vector_3<viennamath::ct_constant<1L>,_viennamath::ct_constant<2L>,_viennamath::ct_constant<5L>_>
  local_230 [2];
  ct_constant<1L> local_22a;
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<4L>_>
  local_229 [9];
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_div<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<2L>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>_>_>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>_>
  local_217;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_div<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<2L>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>_>_>_>
  local_207 [2];
  ct_variable<1UL> local_1f2 [2];
  ct_constant<2L> local_1f0 [3];
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
  local_1ed [3];
  ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
  local_1d8 [2];
  undefined1 local_1d4 [6];
  undefined1 local_1ce [11];
  undefined1 local_1c3 [22];
  viennamath local_1ad [14];
  result_type local_19f;
  type local_14b;
  ct_vector_3<viennamath::ct_constant<1L>,_viennamath::ct_constant<2L>,_viennamath::ct_constant<5L>_>
  local_f5 [10];
  undefined1 local_d6 [5];
  undefined1 local_d1 [9];
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<0L>,_viennamath::op_minus<double>,_viennamath::ct_constant<1L>_>,_viennamath::op_minus<double>,_viennamath::ct_constant<0L>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_mult<double>,_viennamath::ct_constant<1L>_>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_constant<0L>_>_>
  local_c8 [3];
  undefined1 local_9e [5];
  undefined1 local_99 [9];
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<0L>,_viennamath::op_minus<double>,_viennamath::ct_constant<1L>_>,_viennamath::op_minus<double>,_viennamath::ct_constant<0L>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_mult<double>,_viennamath::ct_constant<1L>_>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_constant<0L>_>_>
  local_90;
  ct_vector_3<viennamath::ct_constant<1L>,_viennamath::ct_constant<2L>,_viennamath::ct_constant<5L>_>
  local_82 [7];
  undefined1 local_6c [5];
  undefined1 local_67 [9];
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
  local_5e [4];
  undefined1 local_46 [5];
  undefined1 local_41 [9];
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
  local_38;
  ct_vector_3<viennamath::ct_constant<1L>,_viennamath::ct_constant<2L>,_viennamath::ct_constant<5L>_>
  local_33 [5];
  undefined1 local_22 [5];
  undefined1 local_1d [9];
  undefined1 local_14;
  undefined1 local_13;
  undefined1 local_12 [2];
  undefined1 local_10;
  undefined1 local_f [3];
  ct_variable<2UL> z;
  ct_variable<1UL> y;
  ct_variable<0UL> x;
  ct_constant<7L> c7;
  ct_constant<5L> c5;
  ct_constant<2L> c2;
  ct_constant<1L> c1;
  ct_constant<0L> c0;
  
  _z = (internal_lhs_type)0x0;
  _x = (internal_rhs_type)0x0;
  viennamath::ct_constant<0L>::ct_constant((ct_constant<0L> *)(local_f + 2));
  viennamath::ct_constant<1L>::ct_constant((ct_constant<1L> *)(local_f + 1));
  viennamath::ct_constant<2L>::ct_constant((ct_constant<2L> *)local_f);
  viennamath::ct_constant<5L>::ct_constant((ct_constant<5L> *)&local_10);
  viennamath::ct_constant<7L>::ct_constant((ct_constant<7L> *)(local_12 + 1));
  viennamath::ct_variable<0UL>::ct_variable((ct_variable<0UL> *)local_12);
  viennamath::ct_variable<1UL>::ct_variable((ct_variable<1UL> *)&local_13);
  viennamath::ct_variable<2UL>::ct_variable((ct_variable<2UL> *)&local_14);
  poVar1 = std::operator<<((ostream *)&std::cout,"Evaluate (1-x-y)xy at (1,2,5):");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs);
  viennamath::operator-
            ((type *)local_22,
             (ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
              *)&local_13,rhs_00);
  viennamath::operator*
            ((type *)(local_22 + 2),
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>
              *)local_12,rhs_01);
  viennamath::operator*
            ((type *)local_1d,
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>
              *)&local_13,rhs_02);
  pcVar3 = (ct_constant<2L> *)&local_10;
  viennamath::
  make_vector<viennamath::ct_constant<1l>,viennamath::ct_constant<2l>,viennamath::ct_constant<5l>>
            (local_33,(viennamath *)(local_f + 1),(ct_constant<1L> *)local_f,pcVar3,
             (ct_constant<5L> *)in_R8);
  tVar6 = viennamath::
          eval<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_minus<double>,viennamath::ct_variable<1ul>>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_variable<1ul>>,viennamath::ct_vector_3<viennamath::ct_constant<1l>,viennamath::ct_constant<2l>,viennamath::ct_constant<5l>>>
                    ((ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
                      *)(local_1d + 4),local_33);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,tVar6);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Replace ( (1-x-y)xy, x) and evaluate at (1,2,5):")
  ;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_03);
  viennamath::operator-
            ((type *)local_46,
             (ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
              *)&local_13,rhs_04);
  viennamath::operator*
            ((type *)(local_46 + 2),
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>
              *)local_12,rhs_05);
  viennamath::operator*
            ((type *)local_41,
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>
              *)&local_13,rhs_06);
  viennamath::
  substitute<viennamath::ct_variable<0ul>,viennamath::ct_variable<2ul>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_minus<double>,viennamath::ct_variable<1ul>>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_variable<1ul>>>
            ((type *)local_12,(viennamath *)&local_14,(ct_variable<0UL> *)(local_41 + 4),
             (ct_variable<2UL> *)pcVar3,
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
              *)in_R8);
  poVar1 = viennamath::operator<<((ostream *)&std::cout,&local_38);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_07);
  viennamath::operator-
            ((type *)local_6c,
             (ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
              *)&local_13,rhs_08);
  viennamath::operator*
            ((type *)(local_6c + 2),
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>
              *)local_12,rhs_09);
  viennamath::operator*
            ((type *)local_67,
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>
              *)&local_13,rhs_10);
  viennamath::
  substitute<viennamath::ct_variable<0ul>,viennamath::ct_variable<2ul>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_minus<double>,viennamath::ct_variable<1ul>>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_variable<1ul>>>
            ((type *)local_12,(viennamath *)&local_14,(ct_variable<0UL> *)(local_67 + 4),
             (ct_variable<2UL> *)pcVar3,
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
              *)in_R8);
  pcVar3 = (ct_constant<2L> *)&local_10;
  viennamath::
  make_vector<viennamath::ct_constant<1l>,viennamath::ct_constant<2l>,viennamath::ct_constant<5l>>
            (local_82,(viennamath *)(local_f + 1),(ct_constant<1L> *)local_f,pcVar3,
             (ct_constant<5L> *)in_R8);
  tVar6 = viennamath::
          eval<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<2ul>>,viennamath::op_minus<double>,viennamath::ct_variable<1ul>>,viennamath::op_mult<double>,viennamath::ct_variable<2ul>>,viennamath::op_mult<double>,viennamath::ct_variable<1ul>>,viennamath::ct_vector_3<viennamath::ct_constant<1l>,viennamath::ct_constant<2l>,viennamath::ct_constant<5l>>>
                    (local_5e,local_82);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,tVar6);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Differentiate (1-x-y)xy with respect to x and evaluate the result at (1,2,5):"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_11);
  viennamath::operator-
            ((type *)local_9e,
             (ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
              *)&local_13,rhs_12);
  viennamath::operator*
            ((type *)(local_9e + 2),
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>
              *)local_12,rhs_13);
  viennamath::operator*
            ((type *)local_99,
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>
              *)&local_13,rhs_14);
  viennamath::
  diff<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_minus<double>,viennamath::ct_variable<1ul>>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_variable<1ul>>,0ul>
            ((result_type *)(local_99 + 4),(viennamath *)local_12,extraout_RDX,
             (ct_variable<0UL> *)pcVar3);
  poVar1 = viennamath::operator<<((ostream *)&std::cout,&local_90);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_15);
  viennamath::operator-
            ((type *)local_d6,
             (ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
              *)&local_13,rhs_16);
  viennamath::operator*
            ((type *)(local_d6 + 2),
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>
              *)local_12,rhs_17);
  viennamath::operator*
            ((type *)local_d1,
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>
              *)&local_13,rhs_18);
  viennamath::
  diff<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_minus<double>,viennamath::ct_variable<1ul>>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_variable<1ul>>,0ul>
            ((result_type *)(local_d1 + 4),(viennamath *)local_12,extraout_RDX_00,
             (ct_variable<0UL> *)pcVar3);
  pcVar3 = (ct_constant<2L> *)&local_10;
  viennamath::
  make_vector<viennamath::ct_constant<1l>,viennamath::ct_constant<2l>,viennamath::ct_constant<5l>>
            (local_f5,(viennamath *)(local_f + 1),(ct_constant<1L> *)local_f,pcVar3,
             (ct_constant<5L> *)in_R8);
  tVar6 = viennamath::
          eval<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<0l>,viennamath::op_minus<double>,viennamath::ct_constant<1l>>,viennamath::op_minus<double>,viennamath::ct_constant<0l>>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>,viennamath::op_plus<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_minus<double>,viennamath::ct_variable<1ul>>,viennamath::op_mult<double>,viennamath::ct_constant<1l>>>,viennamath::op_mult<double>,viennamath::ct_variable<1ul>>,viennamath::op_plus<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_minus<double>,viennamath::ct_variable<1ul>>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_constant<0l>>>,viennamath::ct_vector_3<viennamath::ct_constant<1l>,viennamath::ct_constant<2l>,viennamath::ct_constant<5l>>>
                    (local_c8,local_f5);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,tVar6);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Evaluation test of super-complicated expression:")
  ;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_19);
  viennamath::operator/((type *)&local_13,(ct_variable<1UL> *)local_12,rhs_20);
  viennamath::operator-((type *)local_1d4,local_1d8,rhs_21);
  viennamath::operator*
            ((type *)(local_1d4 + 2),
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>_>
              *)local_12,rhs_22);
  viennamath::operator*
            ((type *)local_1ce,
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>
              *)&local_13,rhs_23);
  viennamath::operator+((type *)local_12,(ct_variable<0UL> *)&local_13,rhs_24);
  viennamath::operator/((type *)&local_13,local_1f2,rhs_25);
  viennamath::operator-((type *)local_f,local_1f0,rhs_26);
  viennamath::operator/((type *)(local_1ce + 5),local_1ed,rhs_27);
  viennamath::operator+((type *)local_12,(ct_variable<0UL> *)&local_13,rhs_28);
  viennamath::operator*((type *)local_1c3,local_207,rhs_29);
  viennamath::operator+((type *)&local_14,(ct_variable<2UL> *)local_12,rhs_30);
  viennamath::operator/((type *)(local_1c3 + 10),&local_217,rhs_31);
  viennamath::
  diff<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_variable<1ul>,viennamath::op_div<double>,viennamath::ct_variable<0ul>>>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_variable<1ul>>,viennamath::op_div<double>,viennamath::ct_binary_expr<viennamath::ct_constant<2l>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_variable<1ul>,viennamath::op_div<double>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_variable<1ul>>>>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_variable<1ul>>>,viennamath::op_div<double>,viennamath::ct_binary_expr<viennamath::ct_variable<2ul>,viennamath::op_plus<double>,viennamath::ct_variable<0ul>>>,0ul>
            (&local_19f,local_1ad,
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_div<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<2L>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>_>_>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>_>,_viennamath::op_div<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<0UL>_>_>
              *)local_12,(ct_variable<0UL> *)pcVar3);
  viennamath::operator+<2L,_2L>((ct_constant<2L> *)local_f,(ct_constant<2L> *)local_f);
  viennamath::operator/((type *)(local_f + 1),&local_22a,rhs_32);
  viennamath::operator-(&local_14b,&local_19f,local_229);
  viennamath::
  make_vector<viennamath::ct_constant<1l>,viennamath::ct_constant<2l>,viennamath::ct_constant<5l>>
            (local_230,(viennamath *)(local_f + 1),(ct_constant<1L> *)local_f,
             (ct_constant<2L> *)&local_10,(ct_constant<5L> *)in_R8);
  tVar6 = viennamath::
          eval<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<0l>,viennamath::op_minus<double>,viennamath::ct_constant<1l>>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<0l>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_variable<1ul>,viennamath::op_mult<double>,viennamath::ct_constant<1l>>>,viennamath::op_div<double>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>>>,viennamath::op_mult<do___h::ct_vector_3<viennamath::ct_constant<1l>,viennamath::ct_constant<2l>,viennamath::ct_constant<5l>>>
                    (&local_14b,local_230);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,tVar6);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Expanding (1-x)*(1-y)*(1-z):");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_33);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)&local_13,rhs_34);
  viennamath::operator*((type *)&local_254,local_258,rhs_35);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)&local_14,rhs_36);
  viennamath::operator*((type *)((long)&local_254 + 2),local_260,rhs_37);
  viennamath::
  expand<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<1ul>>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<2ul>>>>
            (&local_248,(viennamath *)((long)&local_254 + 6),extraout_RDX_01);
  poVar1 = viennamath::operator<<((ostream *)&std::cout,&local_248);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_38);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)&local_13,rhs_39);
  viennamath::operator*((type *)local_274,local_278,rhs_40);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)&local_14,rhs_41);
  viennamath::operator*((type *)(local_274 + 2),local_280,rhs_42);
  viennamath::
  make_vector<viennamath::ct_constant<1l>,viennamath::ct_constant<2l>,viennamath::ct_constant<5l>>
            (local_28b,(viennamath *)(local_f + 1),(ct_constant<1L> *)local_f,
             (ct_constant<2L> *)&local_10,(ct_constant<5L> *)in_R8);
  tVar6 = viennamath::
          eval<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<1ul>>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<2ul>>>,viennamath::ct_vector_3<viennamath::ct_constant<1l>,viennamath::ct_constant<2l>,viennamath::ct_constant<5l>>>
                    ((ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>_>
                      *)(local_274 + 6),local_28b);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,tVar6);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_43);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)&local_13,rhs_44);
  viennamath::operator*((type *)&local_2af,local_2b3,rhs_45);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)&local_14,rhs_46);
  viennamath::operator*((type *)((long)&local_2af + 2),local_2bb,rhs_47);
  viennamath::
  expand<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<1ul>>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<2ul>>>>
            (&local_2a3,(viennamath *)((long)&local_2af + 6),extraout_RDX_02);
  t1 = (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>_>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>_>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>_>
        *)&local_10;
  viennamath::
  make_vector<viennamath::ct_constant<1l>,viennamath::ct_constant<2l>,viennamath::ct_constant<5l>>
            (local_2c6,(viennamath *)(local_f + 1),(ct_constant<1L> *)local_f,(ct_constant<2L> *)t1,
             (ct_constant<5L> *)in_R8);
  tVar6 = viennamath::
          eval<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_mult<double>,viennamath::ct_constant<1l>>>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_variable<2ul>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_mult<double>,viennamath::ct_constant<1l>>>>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_variable<1ul>,viennamath::op_mult<double>,viennamath::ct_constant<1l>>>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_variable<2ul>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_variable<1ul>,viennamath::op_mult<double>,viennamath::ct_constant<1l>>>>>,viennamat___h::ct_vector_3<viennamath::ct_constant<1l>,viennamath::ct_constant<2l>,viennamath::ct_constant<5l>>>
                    (&local_2a3,local_2c6);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,tVar6);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Extracting coefficients from (1-x)*(1-y)*(1-z):");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"x: ");
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_48);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)&local_13,rhs_49);
  viennamath::operator*((type *)&local_2de,local_2e2,rhs_50);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)&local_14,rhs_51);
  viennamath::operator*((type *)((long)&local_2de + 2),local_2ea,rhs_52);
  viennamath::
  coefficient<viennamath::ct_variable<0ul>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<1ul>>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<2ul>>>>
            ((type *)local_12,(viennamath *)((long)&local_2de + 6),extraout_RDX_03,
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>_>
              *)t1);
  poVar1 = viennamath::operator<<(poVar1,&local_2d2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"y: ");
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_53);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)&local_13,rhs_54);
  viennamath::operator*((type *)&local_316,local_31a,rhs_55);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)&local_14,rhs_56);
  viennamath::operator*((type *)((long)&local_316 + 2),local_322,rhs_57);
  viennamath::
  coefficient<viennamath::ct_variable<1ul>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<1ul>>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<2ul>>>>
            ((type *)&local_13,(viennamath *)((long)&local_316 + 6),extraout_RDX_04,
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>_>
              *)t1);
  poVar1 = viennamath::operator<<(poVar1,local_30a);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"z: ");
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_58);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)&local_13,rhs_59);
  viennamath::operator*((type *)&local_34e,local_352,rhs_60);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)&local_14,rhs_61);
  viennamath::operator*((type *)((long)&local_34e + 2),local_35a,rhs_62);
  viennamath::
  coefficient<viennamath::ct_variable<2ul>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<1ul>>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<2ul>>>>
            ((type *)&local_14,(viennamath *)((long)&local_34e + 6),extraout_RDX_05,
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>_>
              *)t1);
  poVar1 = viennamath::operator<<(poVar1,local_342);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Dropping coefficients from (1-x)*(1-y)*(1-z):");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Drop x-terms: ");
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_63);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)&local_13,rhs_64);
  viennamath::operator*((type *)&local_37f,local_383,rhs_65);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)&local_14,rhs_66);
  viennamath::operator*((type *)((long)&local_37f + 2),local_38b,rhs_67);
  viennamath::
  drop_dependent_terms<viennamath::ct_variable<0ul>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<1ul>>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<2ul>>>>
            ((type *)local_12,(viennamath *)((long)&local_37f + 6),extraout_RDX_06,
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>_>
              *)t1);
  poVar1 = viennamath::operator<<(poVar1,local_373);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Drop y-terms: ");
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_68);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)&local_13,rhs_69);
  viennamath::operator*((type *)&local_3a9,local_3ad,rhs_70);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)&local_14,rhs_71);
  viennamath::operator*((type *)((long)&local_3a9 + 2),local_3b5,rhs_72);
  viennamath::
  drop_dependent_terms<viennamath::ct_variable<1ul>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<1ul>>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<2ul>>>>
            ((type *)&local_13,(viennamath *)((long)&local_3a9 + 6),extraout_RDX_07,
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>_>
              *)t1);
  poVar1 = viennamath::operator<<(poVar1,local_39d);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Drop z-terms: ");
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_73);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)&local_13,rhs_74);
  viennamath::operator*((type *)&local_3d3,local_3d7,rhs_75);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)&local_14,rhs_76);
  viennamath::operator*((type *)((long)&local_3d3 + 2),local_3df,rhs_77);
  viennamath::
  drop_dependent_terms<viennamath::ct_variable<2ul>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<1ul>>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<2ul>>>>
            ((type *)&local_14,(viennamath *)((long)&local_3d3 + 6),extraout_RDX_08,
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>_>
              *)t1);
  poVar1 = viennamath::operator<<(poVar1,local_3c7);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Integrate x*y:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"with respect to x on [0,1]: ");
  viennamath::make_interval<0l,1l>
            ((ct_constant<0L> *)(local_f + 2),(ct_constant<1L> *)(local_f + 1));
  viennamath::operator*((type *)local_12,(ct_variable<0UL> *)&local_13,rhs_78);
  viennamath::
  integrate<viennamath::ct_constant<0l>,viennamath::ct_constant<1l>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_variable<1ul>>,viennamath::ct_variable<0ul>>
            ((type *)local_3ef,local_3f2,
             (ct_interval<viennamath::ct_constant<0L>,_viennamath::ct_constant<1L>_> *)local_12,
             (ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
              *)t1,in_R8);
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>
                              *)(local_3ef + 1));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"with respect to y on [0,1]: ");
  viennamath::make_interval<0l,1l>
            ((ct_constant<0L> *)(local_f + 2),(ct_constant<1L> *)(local_f + 1));
  viennamath::operator*((type *)local_12,(ct_variable<0UL> *)&local_13,rhs_79);
  viennamath::
  integrate<viennamath::ct_constant<0l>,viennamath::ct_constant<1l>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_variable<1ul>>,viennamath::ct_variable<1ul>>
            ((type *)local_3f9,local_3fc,
             (ct_interval<viennamath::ct_constant<0L>,_viennamath::ct_constant<1L>_> *)&local_13,
             (ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
              *)t1,(ct_variable<1UL> *)in_R8);
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>
                              *)(local_3f9 + 1));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Integrate (1-x)*(1-y)*x*y: ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"with respect to x on [0,1]: ");
  viennamath::make_interval<0l,1l>
            ((ct_constant<0L> *)(local_f + 2),(ct_constant<1L> *)(local_f + 1));
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_80);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)&local_13,rhs_81);
  viennamath::operator*((type *)local_41d,local_421,rhs_82);
  viennamath::operator*
            ((type *)(local_41d + 2),
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>_>
              *)local_12,rhs_83);
  viennamath::operator*
            ((type *)local_417,
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>
              *)&local_13,rhs_84);
  viennamath::
  integrate<viennamath::ct_constant<0l>,viennamath::ct_constant<1l>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<1ul>>>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_variable<1ul>>,viennamath::ct_variable<0ul>>
            ((type *)local_40b,(viennamath *)(local_417 + 5),
             (ct_interval<viennamath::ct_constant<0L>,_viennamath::ct_constant<1L>_> *)local_12,
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
              *)t1,in_R8);
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>_>
                              *)(local_40b + 1));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"with respect to y on [0,1]: ");
  viennamath::make_interval<0l,1l>
            ((ct_constant<0L> *)(local_f + 2),(ct_constant<1L> *)(local_f + 1));
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_85);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)&local_13,rhs_86);
  viennamath::operator*((type *)local_459,local_45d,rhs_87);
  viennamath::operator*
            ((type *)(local_459 + 2),
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>_>
              *)local_12,rhs_88);
  viennamath::operator*
            ((type *)local_453,
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>
              *)&local_13,rhs_89);
  viennamath::
  integrate<viennamath::ct_constant<0l>,viennamath::ct_constant<1l>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<1ul>>>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_variable<1ul>>,viennamath::ct_variable<1ul>>
            ((type *)local_447,(viennamath *)(local_453 + 5),
             (ct_interval<viennamath::ct_constant<0L>,_viennamath::ct_constant<1L>_> *)&local_13,
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
              *)t1,(ct_variable<1UL> *)in_R8);
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>_>
                              *)(local_447 + 1));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Integration on unit triangle:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"1: ");
  viennamath::make_interval<0l,1l>
            ((ct_constant<0L> *)(local_f + 2),(ct_constant<1L> *)(local_f + 1));
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_90);
  viennamath::
  make_interval<0l,viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>
            ((ct_constant<0L> *)(local_f + 2),&local_481);
  viennamath::
  integrate<viennamath::ct_constant<0l>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::ct_constant<1l>,viennamath::ct_variable<1ul>>
            ((type *)&local_47f,(viennamath *)(local_f + 1),
             (ct_interval<viennamath::ct_constant<0L>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>_>
              *)&local_13,(ct_constant<1L> *)t1,(ct_variable<1UL> *)in_R8);
  viennamath::
  integrate<viennamath::ct_constant<0l>,viennamath::ct_constant<1l>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::ct_variable<0ul>>
            ((type *)local_47b,(viennamath *)((long)&local_47f + 1),
             (ct_interval<viennamath::ct_constant<0L>,_viennamath::ct_constant<1L>_> *)local_12,
             (ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
              *)t1,in_R8);
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>
                              *)(local_47b + 1));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"x: ");
  viennamath::make_interval<0l,1l>
            ((ct_constant<0L> *)(local_f + 2),(ct_constant<1L> *)(local_f + 1));
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_91);
  viennamath::
  make_interval<0l,viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>
            ((ct_constant<0L> *)(local_f + 2),&local_494);
  viennamath::
  integrate<viennamath::ct_constant<0l>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::ct_variable<0ul>,viennamath::ct_variable<1ul>>
            ((type *)local_492,(viennamath *)local_12,
             (ct_interval<viennamath::ct_constant<0L>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>_>
              *)&local_13,(ct_variable<0UL> *)t1,(ct_variable<1UL> *)in_R8);
  viennamath::
  integrate<viennamath::ct_constant<0l>,viennamath::ct_constant<1l>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>>,viennamath::op_div<double>,viennamath::ct_constant<2l>>,viennamath::ct_variable<0ul>>
            ((type *)local_48b,(viennamath *)(local_492 + 1),
             (ct_interval<viennamath::ct_constant<0L>,_viennamath::ct_constant<1L>_> *)local_12,
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>_>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>
              *)t1,in_R8);
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<6L>_>
                              *)(local_48b + 1));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"y: ");
  viennamath::make_interval<0l,1l>
            ((ct_constant<0L> *)(local_f + 2),(ct_constant<1L> *)(local_f + 1));
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_92);
  viennamath::
  make_interval<0l,viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>
            ((ct_constant<0L> *)(local_f + 2),&local_4aa);
  viennamath::
  integrate<viennamath::ct_constant<0l>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::ct_variable<1ul>,viennamath::ct_variable<1ul>>
            ((type *)local_4a8,(viennamath *)&local_13,
             (ct_interval<viennamath::ct_constant<0L>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>_>
              *)&local_13,(ct_variable<1UL> *)t1,(ct_variable<1UL> *)in_R8);
  viennamath::
  integrate<viennamath::ct_constant<0l>,viennamath::ct_constant<1l>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>>,viennamath::op_div<double>,viennamath::ct_constant<2l>>,viennamath::ct_variable<0ul>>
            ((type *)local_4a1,(viennamath *)(local_4a8 + 1),
             (ct_interval<viennamath::ct_constant<0L>,_viennamath::ct_constant<1L>_> *)local_12,
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>_>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>
              *)t1,in_R8);
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<6L>_>
                              *)(local_4a1 + 1));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"1-x-y: ");
  viennamath::make_interval<0l,1l>
            ((ct_constant<0L> *)(local_f + 2),(ct_constant<1L> *)(local_f + 1));
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_93);
  viennamath::
  make_interval<0l,viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>
            ((ct_constant<0L> *)(local_f + 2),&local_4c7);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_94);
  viennamath::operator-
            ((type *)local_4cf,
             (ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
              *)&local_13,rhs_95);
  viennamath::
  integrate<viennamath::ct_constant<0l>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_minus<double>,viennamath::ct_variable<1ul>>,viennamath::ct_variable<1ul>>
            ((type *)local_4c5,(viennamath *)(local_4cf + 2),
             (ct_interval<viennamath::ct_constant<0L>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>_>
              *)&local_13,
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>
              *)t1,(ct_variable<1UL> *)in_R8);
  viennamath::
  integrate<viennamath::ct_constant<0l>,viennamath::ct_constant<1l>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>>,viennamath::op_div<double>,viennamath::ct_constant<2l>>>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>>,viennamath::op_div<double>,viennamath::ct_constant<2l>>>,viennamath::ct_variable<0ul>>
            ((type *)local_4b7,(viennamath *)(local_4c5 + 1),
             (ct_interval<viennamath::ct_constant<0L>,_viennamath::ct_constant<1L>_> *)local_12,t1,
             in_R8);
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<6L>_>
                              *)(local_4b7 + 1));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"x^2: ");
  viennamath::make_interval<0l,1l>
            ((ct_constant<0L> *)(local_f + 2),(ct_constant<1L> *)(local_f + 1));
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_96);
  viennamath::
  make_interval<0l,viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>
            ((ct_constant<0L> *)(local_f + 2),&local_4ed);
  viennamath::operator*((type *)local_12,(ct_variable<0UL> *)local_12,rhs_97);
  viennamath::
  integrate<viennamath::ct_constant<0l>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>,viennamath::ct_variable<1ul>>
            ((type *)&local_4eb,local_4f2,
             (ct_interval<viennamath::ct_constant<0L>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>_>
              *)&local_13,
             (ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>
              *)t1,(ct_variable<1UL> *)in_R8);
  viennamath::
  integrate<viennamath::ct_constant<0l>,viennamath::ct_constant<1l>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>>,viennamath::ct_variable<0ul>>
            ((type *)local_4e5,(viennamath *)((long)&local_4eb + 1),
             (ct_interval<viennamath::ct_constant<0L>,_viennamath::ct_constant<1L>_> *)local_12,
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>_>
              *)t1,in_R8);
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<12L>_>
                              *)(local_4e5 + 1));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"y^2: ");
  viennamath::make_interval<0l,1l>
            ((ct_constant<0L> *)(local_f + 2),(ct_constant<1L> *)(local_f + 1));
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_98);
  viennamath::
  make_interval<0l,viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>
            ((ct_constant<0L> *)(local_f + 2),&local_508);
  viennamath::operator*((type *)&local_13,(ct_variable<1UL> *)&local_13,rhs_99);
  viennamath::
  integrate<viennamath::ct_constant<0l>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::ct_binary_expr<viennamath::ct_variable<1ul>,viennamath::op_mult<double>,viennamath::ct_variable<1ul>>,viennamath::ct_variable<1ul>>
            ((type *)local_506,local_50d,
             (ct_interval<viennamath::ct_constant<0L>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>_>
              *)&local_13,
             (ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
              *)t1,(ct_variable<1UL> *)in_R8);
  viennamath::
  integrate<viennamath::ct_constant<0l>,viennamath::ct_constant<1l>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>>>,viennamath::op_div<double>,viennamath::ct_constant<3l>>,viennamath::ct_variable<0ul>>
            ((type *)local_4fd,(viennamath *)(local_506 + 1),
             (ct_interval<viennamath::ct_constant<0L>,_viennamath::ct_constant<1L>_> *)local_12,
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>_>_>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>
              *)t1,in_R8);
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<12L>_>
                              *)(local_4fd + 1));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"(1-x-y)^2: ");
  viennamath::make_interval<0l,1l>
            ((ct_constant<0L> *)(local_f + 2),(ct_constant<1L> *)(local_f + 1));
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_x00100);
  viennamath::
  make_interval<0l,viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>
            ((ct_constant<0L> *)(local_f + 2),&local_54c);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_x00101);
  viennamath::operator-
            ((type *)&local_55a,
             (ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
              *)&local_13,rhs_x00102);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_x00103);
  viennamath::operator-
            ((type *)local_564,
             (ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
              *)&local_13,rhs_x00104);
  viennamath::operator*
            ((type *)((long)&local_55a + 2),
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>
              *)(local_564 + 2),rhs_x00105);
  pcVar4 = (ct_binary_expr<_24bf473d_> *)&local_13;
  viennamath::
  integrate<viennamath::ct_constant<0l>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_minus<double>,viennamath::ct_variable<1ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_minus<double>,viennamath::ct_variable<1ul>>>,viennamath::ct_variable<1ul>>
            (&local_549,&local_54a,
             (ct_interval<viennamath::ct_constant<0L>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>_>
              *)((long)&local_55a + 5),
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>_>
              *)pcVar4,(ct_variable<1UL> *)in_R8);
  viennamath::
  integrate<viennamath::ct_constant<0l>,viennamath::ct_constant<1l>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>>,viennamath::op_div<double>,viennamath::ct_constant<2l>>>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,vienna___able<0ul>>>>,viennamath::op_div<double>,viennamath::ct_constant<3l>>>>,viennamath::ct_variable<0ul>>
            ((type *)local_51b,(viennamath *)&local_549,
             (ct_interval<viennamath::ct_constant<0L>,_viennamath::ct_constant<1L>_> *)local_12,
             pcVar4,in_R8);
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<12L>_>
                              *)(local_51b + 1));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"x*y: ");
  viennamath::make_interval<0l,1l>
            ((ct_constant<0L> *)(local_f + 2),(ct_constant<1L> *)(local_f + 1));
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_x00106);
  viennamath::
  make_interval<0l,viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>
            ((ct_constant<0L> *)(local_f + 2),&local_57e);
  viennamath::operator*((type *)local_12,(ct_variable<0UL> *)&local_13,rhs_x00107);
  viennamath::
  integrate<viennamath::ct_constant<0l>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_variable<1ul>>,viennamath::ct_variable<1ul>>
            ((type *)local_57c,local_583,
             (ct_interval<viennamath::ct_constant<0L>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>_>
              *)&local_13,
             (ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
              *)pcVar4,(ct_variable<1UL> *)in_R8);
  viennamath::
  integrate<viennamath::ct_constant<0l>,viennamath::ct_constant<1l>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>>,viennamath::op_div<double>,viennamath::ct_constant<2l>>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>,viennamath::ct_variable<0ul>>
            ((type *)local_574,(viennamath *)(local_57c + 1),
             (ct_interval<viennamath::ct_constant<0L>,_viennamath::ct_constant<1L>_> *)local_12,
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>_>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>
              *)pcVar4,in_R8);
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<24L>_>
                              *)(local_574 + 1));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"x*(1-x-y): ");
  viennamath::make_interval<0l,1l>
            ((ct_constant<0L> *)(local_f + 2),(ct_constant<1L> *)(local_f + 1));
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_x00108);
  viennamath::
  make_interval<0l,viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>
            ((ct_constant<0L> *)(local_f + 2),&local_5a3);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_x00109);
  viennamath::operator-
            ((type *)local_5af,
             (ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
              *)&local_13,rhs_x00110);
  viennamath::operator*((type *)local_12,(ct_variable<0UL> *)(local_5af + 2),rhs_x00111);
  viennamath::
  integrate<viennamath::ct_constant<0l>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_minus<double>,viennamath::ct_variable<1ul>>>,viennamath::ct_variable<1ul>>
            ((type *)local_5a1,local_5aa,
             (ct_interval<viennamath::ct_constant<0L>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>_>
              *)&local_13,
             (ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>_>
              *)pcVar4,(ct_variable<1UL> *)in_R8);
  viennamath::
  integrate<viennamath::ct_constant<0l>,viennamath::ct_constant<1l>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>>,viennamath::op_div<double>,viennamath::ct_constant<2l>>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>>>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>>,viennamath::op_div<double>,viennamath::ct_constant<2l>>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>>,viennamath::ct_variable<0ul>>
            ((type *)local_590,(viennamath *)(local_5a1 + 1),
             (ct_interval<viennamath::ct_constant<0L>,_viennamath::ct_constant<1L>_> *)local_12,
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>_>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>_>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>_>
              *)pcVar4,in_R8);
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<24L>_>
                              *)(local_590 + 1));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"y*(1-x-y): ");
  viennamath::make_interval<0l,1l>
            ((ct_constant<0L> *)(local_f + 2),(ct_constant<1L> *)(local_f + 1));
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_x00112);
  viennamath::
  make_interval<0l,viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>
            ((ct_constant<0L> *)(local_f + 2),&local_5e2);
  viennamath::operator-((type *)(local_f + 1),(ct_constant<1L> *)local_12,rhs_x00113);
  viennamath::operator-
            ((type *)local_5ee,
             (ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
              *)&local_13,rhs_x00114);
  viennamath::operator*((type *)&local_13,(ct_variable<1UL> *)(local_5ee + 2),rhs_x00115);
  pcVar5 = (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>_>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>_>,_viennamath::op_div<double>,_viennamath::ct_constant<2L>_>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>_>_>,_viennamath::op_div<double>,_viennamath::ct_constant<3L>_>_>
            *)&local_13;
  viennamath::
  integrate<viennamath::ct_constant<0l>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::ct_binary_expr<viennamath::ct_variable<1ul>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_minus<double>,viennamath::ct_variable<1ul>>>,viennamath::ct_variable<1ul>>
            (&local_5df,&local_5e0,local_5e9,
             (ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>_>
              *)pcVar5,(ct_variable<1UL> *)in_R8);
  viennamath::
  integrate<viennamath::ct_constant<0l>,viennamath::ct_constant<1l>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>>,viennamath::op_div<double>,viennamath::ct_constant<2l>>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>>,viennamath::op_div<double>,viennamath::ct_constant<2l>>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<1l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>>>,viennamath::op_div<double>,viennamath::ct_constant<3l>>>,viennamath::ct_variable<0ul>>
            ((type *)local_5cc,(viennamath *)&local_5df,
             (ct_interval<viennamath::ct_constant<0L>,_viennamath::ct_constant<1L>_> *)local_12,
             pcVar5,in_R8);
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_div<double>,_viennamath::ct_constant<24L>_>
                              *)(local_5cc + 1));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"************************************************")
  ;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"*****     TEST COMPLETED SUCCESSFULLY!     *****")
  ;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"************************************************")
  ;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main()
{
  viennamath::ct_constant<0> c0;
  viennamath::ct_constant<1> c1;
  viennamath::ct_constant<2> c2;
  viennamath::ct_constant<5> c5;
  viennamath::ct_constant<7> c7;

  viennamath::ct_variable<0> x;
  viennamath::ct_variable<1> y;
  viennamath::ct_variable<2> z;

  std::cout << "Evaluate (1-x-y)xy at (1,2,5):" << std::endl;
  std::cout << viennamath::eval( (c1 - x - y) * x * y, viennamath::make_vector(c1, c2, c5) ) << std::endl;

  std::cout << "Replace ( (1-x-y)xy, x) and evaluate at (1,2,5):" << std::endl;
  std::cout << viennamath::substitute(x, z, (c1 - x - y) * x * y) << std::endl;
  std::cout << viennamath::eval(
                  viennamath::substitute(x, z, (c1 - x - y) * x * y),
                  viennamath::make_vector(c1, c2, c5)
               ) << std::endl;

  std::cout << "Differentiate (1-x-y)xy with respect to x and evaluate the result at (1,2,5):" << std::endl;
  std::cout << viennamath::diff((c1 - x - y) * x * y, x) << std::endl;
  /*std::cout << viennamath::ct_eval(
                  viennamath::diff((c1 - x - y) * x * y, x),
                  viennamath::make_vector(c1, c2, c5)
               ) << std::endl;*/
  std::cout << viennamath::eval(
                  viennamath::diff((c1 - x - y) * x * y, x),
                  viennamath::make_vector(c1, c2, c5)
               ) << std::endl;

  std::cout << "Evaluation test of super-complicated expression:" << std::endl;
  /*std::cout << viennamath::ct_eval(
                viennamath::diff((c1 - x - y/x) * x * y / (c2 - y / (x + y)) * (x + y) / (z+x), x) - c1 / (c2  + c2),
                viennamath::make_vector(c1, c2, c5)
              ) << std::endl;*/
  std::cout << viennamath::eval(
                viennamath::diff((c1 - x - y/x) * x * y / (c2 - y / (x + y)) * (x + y) / (z+x), x) - c1 / (c2  + c2),
                viennamath::make_vector(c1, c2, c5)
              ) << std::endl;


  std::cout << "Expanding (1-x)*(1-y)*(1-z):" << std::endl;
  std::cout << viennamath::expand( (c1 - x) * (c1 - y) * (c1 - z) ) << std::endl;
  std::cout << viennamath::eval(
                (c1 - x) * (c1 - y) * (c1 - z),
                viennamath::make_vector(c1, c2, c5)
              ) << std::endl;
  std::cout << viennamath::eval(
                viennamath::expand( (c1 - x) * (c1 - y) * (c1 - z) ),
                viennamath::make_vector(c1, c2, c5)
              ) << std::endl;


  std::cout << "Extracting coefficients from (1-x)*(1-y)*(1-z):" << std::endl;
  std::cout << "x: " << viennamath::coefficient(x, (c1 - x) * (c1 - y) * (c1 - z) ) << std::endl;
  std::cout << "y: " << viennamath::coefficient(y, (c1 - x) * (c1 - y) * (c1 - z) ) << std::endl;
  std::cout << "z: " << viennamath::coefficient(z, (c1 - x) * (c1 - y) * (c1 - z) ) << std::endl;

  std::cout << "Dropping coefficients from (1-x)*(1-y)*(1-z):" << std::endl;
  std::cout << "Drop x-terms: " << viennamath::drop_dependent_terms(x, (c1 - x) * (c1 - y) * (c1 - z) ) << std::endl;
  std::cout << "Drop y-terms: " << viennamath::drop_dependent_terms(y, (c1 - x) * (c1 - y) * (c1 - z) ) << std::endl;
  std::cout << "Drop z-terms: " << viennamath::drop_dependent_terms(z, (c1 - x) * (c1 - y) * (c1 - z) ) << std::endl;


  std::cout << "Integrate x*y:" << std::endl;
  std::cout << "with respect to x on [0,1]: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                                        x*y,
                                                                        x) << std::endl;
  std::cout << "with respect to y on [0,1]: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                                        x*y,
                                                                        y) << std::endl;

  std::cout << "Integrate (1-x)*(1-y)*x*y: " << std::endl;

  std::cout << "with respect to x on [0,1]: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                                         (c1-x)*(c1-y)*x*y,
                                                                         x) << std::endl;
  std::cout << "with respect to y on [0,1]: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                                         (c1-x)*(c1-y)*x*y,
                                                                         y) << std::endl;


  std::cout << "Integration on unit triangle:" << std::endl;
  std::cout << "1: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                               viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                      c1,
                                                                      y),
                                               x) << std::endl;
  //linear
  std::cout << "x: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                               viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                      x,
                                                                      y),
                                               x) << std::endl;
  std::cout << "y: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                               viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                      y,
                                                                      y),
                                               x) << std::endl;
  std::cout << "1-x-y: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                   viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                          c1 - x - y,
                                                                          y),
                                                    x) << std::endl;

  //quadratic:
  std::cout << "x^2: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                 viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                        x*x,
                                                                        y),
                                                 x) << std::endl;
  std::cout << "y^2: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                 viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                        y*y,
                                                                        y),
                                                 x) << std::endl;

  std::cout << "(1-x-y)^2: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                       viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                              (c1 - x - y) * (c1 - x - y),
                                                                              y),
                                                       x) << std::endl;
  std::cout << "x*y: " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                 viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                        x*y,
                                                                        y),
                                                 x) << std::endl;
  std::cout << "x*(1-x-y): " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                       viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                              x*(c1 - x - y),
                                                                              y),
                                                       x) << std::endl;
  std::cout << "y*(1-x-y): " << viennamath::integrate( viennamath::make_interval(c0, c1),
                                                       viennamath::integrate( viennamath::make_interval(c0, c1 - x),
                                                                              y*(c1 - x - y),
                                                                              y),
                                                       x) << std::endl;

  std::cout << "************************************************" << std::endl;
  std::cout << "*****     TEST COMPLETED SUCCESSFULLY!     *****" << std::endl;
  std::cout << "************************************************" << std::endl;

  return EXIT_SUCCESS;
}